

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::IsDefinitionSet(cmMakefile *this,string *name)

{
  bool bVar1;
  cmState *this_00;
  cmVariableWatch *this_01;
  cmVariableWatch *vv;
  cmValue local_20;
  cmValue def;
  string *name_local;
  cmMakefile *this_local;
  
  def.Value = name;
  local_20 = cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    this_00 = GetState(this);
    local_20 = cmState::GetInitializedCacheValue(this_00,def.Value);
  }
  this_01 = GetVariableWatch(this);
  if ((this_01 != (cmVariableWatch *)0x0) &&
     (bVar1 = cmValue::operator_cast_to_bool(&local_20), !bVar1)) {
    cmVariableWatch::VariableAccessed(this_01,def.Value,2,(char *)0x0,this);
  }
  bVar1 = ::operator!=(local_20,(nullptr_t)0x0);
  return bVar1;
}

Assistant:

bool cmMakefile::IsDefinitionSet(const std::string& name) const
{
  cmValue def = this->StateSnapshot.GetDefinition(name);
  if (!def) {
    def = this->GetState()->GetInitializedCacheValue(name);
  }
#ifndef CMAKE_BOOTSTRAP
  if (cmVariableWatch* vv = this->GetVariableWatch()) {
    if (!def) {
      vv->VariableAccessed(
        name, cmVariableWatch::UNKNOWN_VARIABLE_DEFINED_ACCESS, nullptr, this);
    }
  }
#endif
  return def != nullptr;
}